

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::PortableLocaltime(time_t seconds,tm *out)

{
  tm *ptVar1;
  tm *out_local;
  time_t seconds_local;
  
  out_local = (tm *)seconds;
  ptVar1 = localtime_r((time_t *)&out_local,(tm *)out);
  return ptVar1 != (tm *)0x0;
}

Assistant:

static bool PortableLocaltime(time_t seconds, struct tm* out) {
#if defined(_MSC_VER)
  return localtime_s(out, &seconds) == 0;
#elif defined(__MINGW32__) || defined(__MINGW64__)
  // MINGW <time.h> provides neither localtime_r nor localtime_s, but uses
  // Windows' localtime(), which has a thread-local tm buffer.
  struct tm* tm_ptr = localtime(&seconds);  // NOLINT
  if (tm_ptr == NULL)
    return false;
  *out = *tm_ptr;
  return true;
#else
  return localtime_r(&seconds, out) != NULL;
#endif
}